

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O1

void slider_orientation(t_slider *x,t_floatarg forient)

{
  short *psVar1;
  long lVar3;
  t_iem_orientation tVar4;
  ushort uVar5;
  ulong uVar2;
  
  tVar4 = (t_iem_orientation)((int)forient != 0);
  if (x->x_orientation != tVar4) {
    lVar3._0_4_ = (x->x_gui).x_h;
    lVar3._4_4_ = (x->x_gui).x_w;
    uVar2._0_4_ = (x->x_gui).x_h;
    uVar2._4_4_ = (x->x_gui).x_w;
    uVar2 = lVar3 << 0x20 | uVar2 >> 0x20;
    (x->x_gui).x_h = (int)uVar2;
    (x->x_gui).x_w = (int)(uVar2 >> 0x20);
    uVar5 = -(ushort)((int)forient != 0) | 1;
    psVar1 = &(x->x_gui).x_obj.te_xpix;
    *psVar1 = *psVar1 + uVar5 * 3;
    psVar1 = &(x->x_gui).x_obj.te_ypix;
    *psVar1 = *psVar1 + uVar5 * -2;
  }
  x->x_orientation = tVar4;
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void slider_orientation(t_slider *x, t_floatarg forient)
{
    int orient = !!(int)forient;
    if(orient != x->x_orientation)
    {
        int w = x->x_gui.x_w;
        x->x_gui.x_w = x->x_gui.x_h;
        x->x_gui.x_h = w;

            /* urgh. for historical reasons,
             * sliders have a different offset depending on their orientation.
             * for backwards-compatibility, an ideal solution would handle
             * these offsets during load/save,
             * but we cannot access the object position in the constructor,
             * so we need to do it here...
             */
        x->x_gui.x_obj.te_xpix += LMARGIN * ((horizontal==orient)?1:-1);
        x->x_gui.x_obj.te_ypix -= TMARGIN * ((horizontal==orient)?1:-1);
    }
    x->x_orientation = orient;

    iemgui_size(x, &x->x_gui);
}